

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O3

void CB_EXPLORE_ADF::predict_or_learn_cover<true>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  pointer *ppfVar1;
  label *this;
  float fVar2;
  float fVar3;
  pointer pfVar4;
  iterator __position;
  action_score *paVar5;
  undefined1 auVar6 [12];
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t i;
  ulong uVar11;
  float *__args;
  uint uVar12;
  vector<float,std::allocator<float>> *this_00;
  example *peVar13;
  uint uVar14;
  long lVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  undefined4 in_XMM2_Db;
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  ulong local_98;
  vector<float,std::allocator<float>> *local_90;
  float local_88;
  example *local_78;
  v_array<COST_SENSITIVE::label> *local_70;
  v_array<CB::label> *local_68;
  multi_ex *local_60;
  undefined1 local_58 [16];
  pointer_____offset_0x10___ *local_40;
  action_score *local_38;
  
  if ((data->gen_cs).cb_type == 3) {
    GEN_CS::gen_cs_example_dr<true>(&data->gen_cs,examples,&data->cs_labels);
  }
  else {
    GEN_CS::gen_cs_example<false>(&data->gen_cs,examples,&data->cs_labels);
  }
  LEARNER::multiline_learn_or_predict<true>(base,examples,data->offset,0);
  peVar13 = *(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_98 = (long)(peVar13->pred).scalars._end - (long)(peVar13->pred).scalars._begin >> 3;
  local_a8 = (float)data->cover_size;
  uVar14 = (uint)local_98;
  local_98 = local_98 & 0xffffffff;
  local_88 = (float)local_98;
  lVar7 = data->counter * local_98;
  auVar17._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar17._0_8_ = lVar7;
  auVar17._12_4_ = 0x45300000;
  dVar16 = SQRT((auVar17._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
  auVar6._4_8_ = (ulong)dVar16 >> 0x20;
  auVar6._0_4_ = (float)dVar16;
  auVar18._0_8_ = auVar6._0_8_;
  auVar18._8_4_ = (int)((ulong)dVar16 >> 0x20);
  auVar18._12_4_ = in_XMM2_Db;
  local_c8._4_4_ = local_88;
  local_c8._0_4_ = (float)dVar16;
  local_c8._8_8_ = auVar18._8_8_;
  local_60 = examples;
  v_array<ACTION_SCORE::action_score>::clear(&data->action_probs);
  if (uVar14 != 0) {
    uVar12 = 0;
    do {
      local_d8._4_4_ = 0;
      local_d8._0_4_ = uVar12;
      v_array<ACTION_SCORE::action_score>::push_back(&data->action_probs,(action_score *)local_d8);
      uVar12 = uVar12 + 1;
    } while (uVar14 != uVar12);
  }
  uVar10 = local_98;
  auVar21 = divps(_DAT_00284f10,local_c8);
  pfVar4 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar4) {
    (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = pfVar4;
  }
  uStack_b0 = auVar21._4_4_;
  local_b8 = CONCAT44(uStack_b0,uStack_b0);
  this_00 = (vector<float,std::allocator<float>> *)&data->scores;
  uStack_ac = uStack_b0;
  local_90 = this_00;
  if (uVar14 != 0) {
    lVar7 = local_98 * 8;
    lVar15 = 0;
    local_c8 = auVar21;
    do {
      __args = (float *)((long)(peVar13->pred).scalars._begin + lVar15 + 4);
      __position._M_current =
           (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  (this_00,__position,__args);
        this_00 = local_90;
        auVar21 = local_c8;
      }
      else {
        *__position._M_current = *__args;
        ppfVar1 = &(data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppfVar1 = *ppfVar1 + 1;
      }
      lVar15 = lVar15 + 8;
    } while (lVar7 - lVar15 != 0);
  }
  fVar22 = 1.0 / local_a8;
  if ((float)local_b8 <= auVar21._0_4_) {
    auVar21._0_4_ = (float)local_b8;
  }
  if (data->first_only == false) {
    paVar5 = (peVar13->pred).a_s._begin;
    lVar7 = (long)(peVar13->pred).scalars._end - (long)paVar5;
    if (lVar7 != 0) {
      uVar11 = lVar7 >> 3;
      uVar9 = 1;
      uVar8 = uVar9;
      if (1 < uVar11) {
        do {
          uVar8 = uVar9;
          if ((paVar5[uVar9].score != paVar5->score) ||
             (NAN(paVar5[uVar9].score) || NAN(paVar5->score))) break;
          uVar9 = uVar9 + 1;
          uVar8 = uVar11;
        } while (uVar11 != uVar9);
      }
      uVar9 = 0;
      do {
        fVar23 = (peVar13->pred).scalars._begin[uVar9 * 2];
        paVar5 = (data->action_probs)._begin;
        paVar5[(uint)fVar23].score = paVar5[(uint)fVar23].score + fVar22 / (float)uVar8;
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
  }
  else {
    uVar12 = ((peVar13->pred).a_s._begin)->action;
    paVar5 = (data->action_probs)._begin;
    paVar5[uVar12].score = paVar5[uVar12].score + fVar22;
  }
  local_88 = local_88 * auVar21._0_4_;
  uVar8 = uVar10;
  if (1 < data->cover_size) {
    uStack_a4 = 0;
    uStack_a0 = 0;
    uStack_9c = 0;
    fVar23 = (fVar22 - auVar21._0_4_) + local_88;
    this = &data->cs_labels_2;
    local_68 = &data->cb_labels;
    local_70 = &data->prepped_cs_labels;
    local_b8 = 1;
    local_58 = ZEXT416((uint)fVar22);
    local_c8 = auVar21;
    local_78 = peVar13;
    do {
      local_a8 = fVar23;
      v_array<COST_SENSITIVE::wclass>::clear(&this->costs);
      if (uVar14 != 0) {
        lVar7 = 0;
        fVar22 = 0.0;
        do {
          fVar23 = *(float *)((long)&((data->action_probs)._begin)->score + lVar7);
          fVar19 = (float)local_c8._0_4_;
          if ((float)local_c8._0_4_ <= fVar23) {
            fVar19 = fVar23;
          }
          local_d8._4_4_ = fVar22;
          local_d8._0_4_ =
               *(float *)((long)&((data->cs_labels).costs._begin)->x + lVar7 * 2) -
               (data->psi * (float)local_c8._0_4_) / (fVar19 / local_a8);
          local_d0._0_4_ = 0.0;
          local_d0._4_4_ = 0.0;
          v_array<COST_SENSITIVE::wclass>::push_back(&this->costs,(wclass *)local_d8);
          fVar22 = (float)((int)fVar22 + 1);
          lVar7 = lVar7 + 8;
        } while (uVar10 * 8 - lVar7 != 0);
      }
      local_b8 = local_b8 + 1;
      GEN_CS::call_cs_ldf<true>
                (data->cs_ldf_learner,local_60,local_68,this,local_70,data->offset,local_b8);
      if (uVar14 != 0) {
        uVar8 = 0;
        do {
          *(float *)(*(long *)local_90 + uVar8 * 4) =
               (local_78->pred).a_s._begin[uVar8].score + *(float *)(*(long *)local_90 + uVar8 * 4);
          uVar8 = uVar8 + 1;
        } while (local_98 != uVar8);
      }
      fVar22 = local_c8._0_4_;
      if (data->first_only == false) {
        paVar5 = (local_78->pred).a_s._begin;
        lVar7 = (long)(local_78->pred).scalars._end - (long)paVar5;
        fVar23 = local_a8;
        if (lVar7 != 0) {
          uVar11 = lVar7 >> 3;
          uVar9 = 1;
          uVar8 = uVar9;
          if (1 < uVar11) {
            do {
              uVar8 = uVar9;
              if ((paVar5[uVar9].score != paVar5->score) ||
                 (NAN(paVar5[uVar9].score) || NAN(paVar5->score))) break;
              uVar9 = uVar9 + 1;
              uVar8 = uVar11;
            } while (uVar11 != uVar9);
          }
          fVar19 = (float)local_58._0_4_ / (float)uVar8;
          uVar9 = 0;
          do {
            fVar3 = (local_78->pred).scalars._begin[uVar9 * 2];
            paVar5 = (data->action_probs)._begin;
            fVar2 = paVar5[(uint)fVar3].score;
            fVar20 = (fVar2 - fVar22) + fVar19;
            uVar11 = (ulong)fVar20;
            fVar23 = fVar23 + (float)(~-(uint)(fVar2 < fVar22) & (uint)fVar19 |
                                     (uint)(float)((long)(fVar20 - 9.223372e+18) &
                                                   (long)uVar11 >> 0x3f | uVar11) &
                                     -(uint)(fVar2 < fVar22));
            paVar5[(uint)fVar3].score = fVar19 + fVar2;
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
        }
      }
      else {
        uVar12 = ((local_78->pred).a_s._begin)->action;
        paVar5 = (data->action_probs)._begin;
        fVar23 = paVar5[uVar12].score;
        fVar19 = (fVar23 - fVar22) + (float)local_58._0_4_;
        uVar8 = (ulong)fVar19;
        paVar5[uVar12].score = (float)local_58._0_4_ + fVar23;
        fVar23 = local_a8 +
                 (float)(~-(uint)(fVar23 < fVar22) & local_58._0_4_ |
                        (uint)(float)((long)(fVar19 - 9.223372e+18) & (long)uVar8 >> 0x3f | uVar8) &
                        -(uint)(fVar23 < fVar22));
      }
      uVar8 = local_98;
      peVar13 = local_78;
    } while (local_b8 < data->cover_size);
  }
  local_d0 = (data->action_probs)._begin;
  local_38 = (data->action_probs)._end;
  local_d8 = (undefined1  [8])
             &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_40 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>(data->nounif ^ 1);
  do_sort(data);
  if (uVar8 != 0) {
    uVar10 = 0;
    do {
      *(action_score *)((peVar13->pred).scalars._begin + uVar10 * 2) =
           (data->action_probs)._begin[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar8 != uVar10);
  }
  data->counter = data->counter + 1;
  return;
}

Assistant:

void predict_or_learn_cover(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Randomize over predictions from a base set of predictors
  // Use cost sensitive oracle to cover actions to form distribution.
  const bool is_mtr = data.gen_cs.cb_type == CB_TYPE_MTR;
  if (is_learn)
  {
    if (is_mtr)  // use DR estimates for non-ERM policies in MTR
      GEN_CS::gen_cs_example_dr<true>(data.gen_cs, examples, data.cs_labels);
    else
      GEN_CS::gen_cs_example<false>(data.gen_cs, examples, data.cs_labels);
    multiline_learn_or_predict<true>(base, examples, data.offset);
  }
  else
  {
    GEN_CS::gen_cs_example_ips(examples, data.cs_labels);
    multiline_learn_or_predict<false>(base, examples, data.offset);
  }

  v_array<action_score>& preds = examples[0]->pred.a_s;
  const uint32_t num_actions = (uint32_t)preds.size();

  float additive_probability = 1.f / (float)data.cover_size;
  const float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(data.counter * num_actions));
  v_array<action_score>& probs = data.action_probs;
  probs.clear();
  for (uint32_t i = 0; i < num_actions; i++) probs.push_back({i, 0.});
  data.scores.clear();
  for (uint32_t i = 0; i < num_actions; i++) data.scores.push_back(preds[i].score);

  if (!data.first_only)
  {
    size_t tied_actions = fill_tied(data, preds);
    for (size_t i = 0; i < tied_actions; ++i) probs[preds[i].action].score += additive_probability / tied_actions;
  }
  else
    probs[preds[0].action].score += additive_probability;

  float norm = min_prob * num_actions + (additive_probability - min_prob);
  for (size_t i = 1; i < data.cover_size; i++)
  {
    // Create costs of each action based on online cover
    if (is_learn)
    {
      data.cs_labels_2.costs.clear();
      for (uint32_t j = 0; j < num_actions; j++)
      {
        float pseudo_cost = data.cs_labels.costs[j].x - data.psi * min_prob / (max(probs[j].score, min_prob) / norm);
        data.cs_labels_2.costs.push_back({pseudo_cost, j, 0., 0.});
      }
      GEN_CS::call_cs_ldf<true>(*(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels_2,
          data.prepped_cs_labels, data.offset, i + 1);
    }
    else
      GEN_CS::call_cs_ldf<false>(
          *(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels, data.prepped_cs_labels, data.offset, i + 1);

    for (uint32_t i = 0; i < num_actions; i++) data.scores[i] += preds[i].score;
    if (!data.first_only)
    {
      size_t tied_actions = fill_tied(data, preds);
      const float add_prob = additive_probability / tied_actions;
      for (size_t i = 0; i < tied_actions; ++i)
      {
        if (probs[preds[i].action].score < min_prob)
          norm += max(0, add_prob - (min_prob - probs[preds[i].action].score));
        else
          norm += add_prob;
        probs[preds[i].action].score += add_prob;
      }
    }
    else
    {
      uint32_t action = preds[0].action;
      if (probs[action].score < min_prob)
        norm += max(0, additive_probability - (min_prob - probs[action].score));
      else
        norm += additive_probability;
      probs[action].score += additive_probability;
    }
  }

  enforce_minimum_probability(min_prob * num_actions, !data.nounif, begin_scores(probs), end_scores(probs));

  do_sort(data);
  for (size_t i = 0; i < num_actions; i++) preds[i] = probs[i];

  ++data.counter;
}